

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::Snapshot::InitializeFromParent_ForSubdirsCommand(Snapshot *this)

{
  char *pcVar1;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88 [8];
  string currentBinDir;
  allocator local_51;
  string local_50;
  string local_30 [8];
  string currentSrcDir;
  Snapshot *this_local;
  
  currentSrcDir.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CMAKE_CURRENT_SOURCE_DIR",&local_51);
  pcVar1 = GetDefinition(this,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,pcVar1,(allocator *)(currentBinDir.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(currentBinDir.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"CMAKE_CURRENT_BINARY_DIR",&local_a9);
  pcVar1 = GetDefinition(this,&local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar1,&local_aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  InitializeFromParent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"CMAKE_SOURCE_DIR",&local_d1);
  pcVar1 = GetSourceDirectory(this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,pcVar1,&local_f9);
  SetDefinition(this,&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"CMAKE_BINARY_DIR",&local_121);
  pcVar1 = GetBinaryDirectory(this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,pcVar1,&local_149);
  SetDefinition(this,&local_120,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"CMAKE_CURRENT_SOURCE_DIR",&local_171);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,pcVar1,&local_199);
  SetDefinition(this,&local_170,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"CMAKE_CURRENT_BINARY_DIR",&local_1c1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,pcVar1,&local_1e9);
  SetDefinition(this,&local_1c0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmState::Snapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR",
                      this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir.c_str());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir.c_str());
}